

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall Token::Token(Token *this,string *_content)

{
  bool bVar1;
  runtime_error *this_00;
  Type TVar2;
  string_view find;
  string_view content;
  string_view content_00;
  string_view replacement;
  string_view str;
  string_view str_00;
  
  std::__cxx11::string::string((string *)this,(string *)_content);
  find._M_str = "%3A";
  find._M_len = 3;
  replacement._M_str = ":";
  replacement._M_len = 1;
  ::str::replace_all(&this->content,find,replacement);
  content._M_str = "std::";
  content._M_len = 5;
  str._M_str = (this->content)._M_dataplus._M_p;
  str._M_len = (this->content)._M_string_length;
  bVar1 = ::str::starts_with(str,content);
  if (bVar1) {
    TVar2 = std;
    stripToken(this);
  }
  else {
    content_00._M_str = "<";
    content_00._M_len = 1;
    str_00._M_str = (this->content)._M_dataplus._M_p;
    str_00._M_len = (this->content)._M_string_length;
    bVar1 = ::str::starts_with(str_00,content_00);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unknown token");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar2 = header;
  }
  this->type = TVar2;
  return;
}

Assistant:

Token(std::string _content) :
            content(std::move(_content)) {
        str::replace_all(content, "%3A", ":");

        if (str::starts_with(content, "std::")) {
            stripToken();
            type = Type::std;
        } else if (str::starts_with(content, "<")) {
            type = Type::header;
        } else {
            throw std::runtime_error("unknown token");
        }
    }